

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_sender.c
# Opt level: O2

void on_delivery_settled(void *context,delivery_number delivery_no,
                        LINK_DELIVERY_SETTLE_REASON reason,AMQP_VALUE delivery_state)

{
  MESSAGE_SENDER_INSTANCE *message_sender;
  _Bool _Var1;
  AMQP_VALUE descriptor;
  AMQP_VALUE pAVar2;
  LOGGER_LOG UNRECOVERED_JUMPTABLE;
  undefined8 uVar3;
  undefined8 uStack_30;
  
  if (*(code **)((long)context + 0x10) == (code *)0x0) {
    return;
  }
  message_sender = *(MESSAGE_SENDER_INSTANCE **)((long)context + 0x20);
  switch(reason) {
  case LINK_DELIVERY_SETTLE_REASON_DISPOSITION_RECEIVED:
    if (delivery_state == (AMQP_VALUE)0x0) {
      UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
      if (UNRECOVERED_JUMPTABLE == (LOGGER_LOG)0x0) {
        return;
      }
      (*UNRECOVERED_JUMPTABLE)
                (AZ_LOG_ERROR,
                 "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/message_sender.c"
                 ,"on_delivery_settled",0x7a,1,"delivery state not provided");
      return;
    }
    descriptor = amqpvalue_get_inplace_descriptor(delivery_state);
    pAVar2 = amqpvalue_get_inplace_described_value(delivery_state);
    if (descriptor == (AMQP_VALUE)0x0) {
      UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
      if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
        (*UNRECOVERED_JUMPTABLE)
                  (AZ_LOG_ERROR,
                   "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/message_sender.c"
                   ,"on_delivery_settled",0x83,1,"Error getting descriptor for delivery state");
      }
      (**(code **)((long)context + 0x10))(*(undefined8 *)((long)context + 0x18),2,pAVar2);
    }
    else {
      _Var1 = is_accepted_type_by_descriptor(descriptor);
      if (_Var1) {
        uStack_30 = 1;
      }
      else {
        uStack_30 = 2;
      }
      (**(code **)((long)context + 0x10))(*(undefined8 *)((long)context + 0x18),uStack_30,pAVar2);
    }
    goto LAB_0011719a;
  case LINK_DELIVERY_SETTLE_REASON_SETTLED:
    uVar3 = *(undefined8 *)((long)context + 0x18);
    uStack_30 = 1;
    break;
  default:
    uVar3 = *(undefined8 *)((long)context + 0x18);
    uStack_30 = 2;
    break;
  case LINK_DELIVERY_SETTLE_REASON_TIMEOUT:
    uVar3 = *(undefined8 *)((long)context + 0x18);
    uStack_30 = 3;
    break;
  case LINK_DELIVERY_SETTLE_REASON_CANCELLED:
    uVar3 = *(undefined8 *)((long)context + 0x18);
    uStack_30 = 4;
  }
  (**(code **)((long)context + 0x10))(uVar3,uStack_30,0);
LAB_0011719a:
  remove_pending_message(message_sender,(ASYNC_OPERATION_HANDLE)context);
  return;
}

Assistant:

static void on_delivery_settled(void* context, delivery_number delivery_no, LINK_DELIVERY_SETTLE_REASON reason, AMQP_VALUE delivery_state)
{
    ASYNC_OPERATION_HANDLE pending_send = (ASYNC_OPERATION_HANDLE)context;
    MESSAGE_WITH_CALLBACK* message_with_callback = GET_ASYNC_OPERATION_CONTEXT(MESSAGE_WITH_CALLBACK, pending_send);
    (void)delivery_no;

    if (message_with_callback != NULL && 
        message_with_callback->on_message_send_complete != NULL)
    {
        MESSAGE_SENDER_INSTANCE *message_sender = (MESSAGE_SENDER_INSTANCE *)message_with_callback->message_sender;
        switch (reason)
        {
        case LINK_DELIVERY_SETTLE_REASON_DISPOSITION_RECEIVED:
            if (delivery_state == NULL)
            {
                LogError("delivery state not provided");
            }
            else
            {
                AMQP_VALUE descriptor = amqpvalue_get_inplace_descriptor(delivery_state);
                AMQP_VALUE described = amqpvalue_get_inplace_described_value(delivery_state);

                if (descriptor == NULL)
                {
                    LogError("Error getting descriptor for delivery state");
                    message_with_callback->on_message_send_complete(message_with_callback->context, MESSAGE_SEND_ERROR, described);
                }
                else
                {
                    if (is_accepted_type_by_descriptor(descriptor))
                    {
                        message_with_callback->on_message_send_complete(message_with_callback->context, MESSAGE_SEND_OK, described);
                    }
                    else
                    {
                        message_with_callback->on_message_send_complete(message_with_callback->context, MESSAGE_SEND_ERROR, described);
                    }
                }

                remove_pending_message(message_sender, pending_send);
            }

            break;
        case LINK_DELIVERY_SETTLE_REASON_SETTLED:
            message_with_callback->on_message_send_complete(message_with_callback->context, MESSAGE_SEND_OK, NULL);
            remove_pending_message(message_sender, pending_send);
            break;
        case LINK_DELIVERY_SETTLE_REASON_TIMEOUT:
            message_with_callback->on_message_send_complete(message_with_callback->context, MESSAGE_SEND_TIMEOUT, NULL);
            remove_pending_message(message_sender, pending_send);
            break;
        case LINK_DELIVERY_SETTLE_REASON_CANCELLED:
            message_with_callback->on_message_send_complete(message_with_callback->context, MESSAGE_SEND_CANCELLED, NULL);
            remove_pending_message(message_sender, pending_send);
            break;
        case LINK_DELIVERY_SETTLE_REASON_NOT_DELIVERED:
        default:
            message_with_callback->on_message_send_complete(message_with_callback->context, MESSAGE_SEND_ERROR, NULL);
            remove_pending_message(message_sender, pending_send);
            break;
        }
    }
}